

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  size_t itime;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar80;
  undefined1 auVar81 [64];
  float fVar82;
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  Vec3fa n0;
  Vec3fa n1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  size_t local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  ulong local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 uStack_178;
  undefined8 uStack_170;
  anon_class_16_2_07cfa4d6 local_168;
  float local_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined1 local_108 [16];
  float local_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_218._8_4_ = 0x7f800000;
  local_218._0_8_ = 0x7f8000007f800000;
  local_218._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_228._8_4_ = 0xff800000;
  local_228._0_8_ = 0xff800000ff800000;
  local_228._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar27._8_8_ = 0;
  auVar27._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar27._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar41._8_8_ = 0;
  auVar41._0_4_ = time_range->lower;
  auVar41._4_4_ = time_range->upper;
  uVar24 = vcmpps_avx512vl(auVar27,auVar41,1);
  auVar26 = vinsertps_avx(auVar41,auVar27,0x50);
  auVar27 = vinsertps_avx(auVar27,auVar41,0x50);
  auVar41 = in_YmmResult._16_16_;
  bVar9 = (bool)((byte)uVar24 & 1);
  auVar25._0_4_ = (float)((uint)bVar9 * auVar26._0_4_ | (uint)!bVar9 * auVar27._0_4_);
  bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar25._4_4_ = (uint)bVar9 * auVar26._4_4_ | (uint)!bVar9 * auVar27._4_4_;
  bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar25._8_4_ = (uint)bVar9 * auVar26._8_4_ | (uint)!bVar9 * auVar27._8_4_;
  bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar25._12_4_ = (uint)bVar9 * auVar26._12_4_ | (uint)!bVar9 * auVar27._12_4_;
  auVar26 = vmovshdup_avx(auVar25);
  fVar82 = auVar26._0_4_;
  if (auVar25._0_4_ <= fVar82) {
    uVar24 = r->_begin;
    if (uVar24 < r->_end) {
      local_270 = 0;
      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
      local_248._8_4_ = 0x7f800000;
      local_248._0_8_ = 0x7f8000007f800000;
      local_248._12_4_ = 0x7f800000;
      local_218._8_4_ = 0x7f800000;
      local_218._0_8_ = 0x7f8000007f800000;
      local_218._12_4_ = 0x7f800000;
      local_238._8_4_ = 0xff800000;
      local_238._0_8_ = 0xff800000ff800000;
      local_238._12_4_ = 0xff800000;
      local_228._8_4_ = 0xff800000;
      local_228._0_8_ = 0xff800000ff800000;
      local_228._12_4_ = 0xff800000;
      local_250 = k;
      do {
        auVar28 = auVar81._0_16_;
        BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar39._8_8_ = 0;
        auVar39._0_4_ = BVar1.lower;
        auVar39._4_4_ = BVar1.upper;
        auVar26 = vmovshdup_avx(auVar39);
        fVar67 = BVar1.lower;
        fVar12 = auVar26._0_4_ - fVar67;
        auVar26._0_4_ = (auVar25._0_4_ - fVar67) / fVar12;
        auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar26 = vmulss_avx512f(auVar26,SUB6416(ZEXT464(0x3f800002),0));
        auVar27 = vmulss_avx512f(ZEXT416((uint)((fVar82 - fVar67) / fVar12)),
                                 SUB6416(ZEXT464(0x3f7ffffc),0));
        uVar2 = *(uint *)(*(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.field_0x68 * uVar24);
        uVar17 = (ulong)uVar2;
        uVar18 = (ulong)(uVar2 + 1);
        pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar18 < (pBVar3->super_RawBufferView).num) {
          fVar12 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar26 = ZEXT416((uint)(fVar12 * auVar26._0_4_));
          auVar26 = vroundss_avx(auVar26,auVar26,9);
          auVar26 = vmaxss_avx(auVar28,auVar26);
          auVar27 = ZEXT416((uint)(fVar12 * auVar27._0_4_));
          auVar27 = vroundss_avx(auVar27,auVar27,10);
          auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar12));
          if ((uint)(int)auVar26._0_4_ <= (uint)(int)auVar27._0_4_) {
            uVar21 = (ulong)(int)auVar26._0_4_;
            pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.normals.items;
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.dnormals.items;
            fVar67 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.maxRadiusScale;
            uStack_1b8 = bezier_basis0._492_8_;
            uStack_1b0 = bezier_basis0._500_8_;
            fStack_1c4 = SUB84(bezier_basis0._476_8_,4);
            fStack_1c0 = (float)bezier_basis0._484_8_;
            fStack_1bc = SUB84(bezier_basis0._484_8_,4);
            fStack_200 = (float)bezier_basis0._1640_8_;
            fStack_1fc = SUB84(bezier_basis0._1640_8_,4);
            uStack_178 = bezier_basis0._2804_8_;
            uStack_170 = bezier_basis0._2812_8_;
            fStack_184 = SUB84(bezier_basis0._2788_8_,4);
            fStack_180 = (float)bezier_basis0._2796_8_;
            fStack_17c = SUB84(bezier_basis0._2796_8_,4);
            uStack_1a0 = bezier_basis0._3952_8_;
            uStack_198 = bezier_basis0._3960_8_;
            uStack_190 = bezier_basis0._3968_8_;
            uStack_1a4 = SUB84(bezier_basis0._3944_8_,4);
            local_d8 = bezier_basis0._5100_8_;
            uStack_d0 = bezier_basis0._5108_8_;
            uStack_c8 = bezier_basis0._5116_8_;
            uStack_c0 = bezier_basis0._5124_8_;
            uStack_150 = bezier_basis0._6264_8_;
            uStack_148 = bezier_basis0._6272_8_;
            uStack_140 = bezier_basis0._6280_8_;
            uStack_154 = SUB84(bezier_basis0._6256_8_,4);
            uStack_f0 = bezier_basis0._7420_8_;
            uStack_e8 = bezier_basis0._7428_8_;
            uStack_e0 = bezier_basis0._7436_8_;
            local_f8 = (float)bezier_basis0._7412_8_;
            uStack_f4 = SUB84(bezier_basis0._7412_8_,4);
            local_58 = bezier_basis0._8568_8_;
            uStack_50 = bezier_basis0._8576_8_;
            uStack_48 = bezier_basis0._8584_8_;
            uStack_40 = bezier_basis0._8592_8_;
            lVar22 = uVar21 * 0x38 + 0x10;
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
            auVar28._8_4_ = 0x5dccb9a2;
            auVar28._0_8_ = 0x5dccb9a25dccb9a2;
            auVar28._12_4_ = 0x5dccb9a2;
            do {
              lVar7 = *(long *)((long)pBVar3 + lVar22 + -0x10);
              lVar8 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar22);
              auVar39 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar17);
              uVar14 = vcmpps_avx512vl(auVar39,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar39,auVar28,1);
              if ((byte)((byte)uVar14 & (byte)uVar13) != 0xf) {
LAB_01ef610c:
                auVar81 = ZEXT864(0);
                goto LAB_01ef6469;
              }
              auVar37 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar18);
              uVar14 = vcmpps_avx512vl(auVar37,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar37,auVar28,1);
              if ((byte)((byte)uVar14 & (byte)uVar13) != 0xf) goto LAB_01ef610c;
              lVar7 = *(long *)((long)pBVar5 + lVar22 + -0x10);
              lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar22);
              auVar29 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar17);
              uVar14 = vcmpps_avx512vl(auVar29,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar29,auVar28,1);
              if ((byte)((byte)uVar14 & (byte)uVar13) != 0xf) goto LAB_01ef610c;
              auVar30 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar18);
              uVar14 = vcmpps_avx512vl(auVar30,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar30,auVar28,1);
              if ((byte)((byte)uVar14 & (byte)uVar13) != 0xf) goto LAB_01ef610c;
              lVar7 = *(long *)((long)pBVar4 + lVar22 + -0x10);
              lVar8 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar22);
              auVar40 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar17);
              uVar14 = vcmpps_avx512vl(auVar40,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar40,auVar28,1);
              if ((~((ushort)uVar14 & (ushort)uVar13) & 7) != 0) goto LAB_01ef610c;
              auVar42 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar18);
              uVar14 = vcmpps_avx512vl(auVar42,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar42,auVar28,1);
              if ((~((ushort)uVar14 & (ushort)uVar13) & 7) != 0) goto LAB_01ef610c;
              lVar7 = *(long *)((long)pBVar6 + lVar22 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar22);
              auVar31 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar17);
              uVar14 = vcmpps_avx512vl(auVar31,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar31,auVar28,1);
              if ((~((ushort)uVar14 & (ushort)uVar13) & 7) != 0) goto LAB_01ef610c;
              auVar32 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar18);
              uVar14 = vcmpps_avx512vl(auVar32,auVar26,6);
              uVar13 = vcmpps_avx512vl(auVar32,auVar28,1);
              if ((~((ushort)uVar14 & (ushort)uVar13) & 7) != 0) goto LAB_01ef610c;
              auVar28 = vshufps_avx512vl(auVar39,auVar39,0xff);
              auVar28 = vmulss_avx512f(auVar28,ZEXT416((uint)fVar67));
              auVar28 = vinsertps_avx512f(auVar39,auVar28,0x30);
              auVar39 = vshufps_avx(auVar37,auVar37,0xff);
              auVar37 = vinsertps_avx512f(auVar37,ZEXT416((uint)(auVar39._0_4_ * fVar67)),0x30);
              auVar39 = vshufps_avx(auVar29,auVar29,0xff);
              auVar29 = vinsertps_avx512f(auVar29,ZEXT416((uint)(auVar39._0_4_ * fVar67)),0x30);
              auVar39 = vshufps_avx(auVar30,auVar30,0xff);
              auVar39 = vinsertps_avx512f(auVar30,ZEXT416((uint)(auVar39._0_4_ * fVar67)),0x30);
              auVar33._8_4_ = 0xbeaaaaab;
              auVar33._0_8_ = 0xbeaaaaabbeaaaaab;
              auVar33._12_4_ = 0xbeaaaaab;
              auVar29 = vfnmadd213ps_avx512vl(auVar29,auVar33,auVar28);
              auVar30 = vfmadd213ps_avx512vl(auVar39,auVar33,auVar37);
              auVar39 = vfnmadd213ps_fma(auVar31,auVar33,auVar40);
              auVar31 = vfmadd213ps_avx512vl(auVar32,auVar33,auVar42);
              auVar35 = auVar83._0_16_;
              auVar32 = vmulps_avx512vl(auVar37,auVar35);
              auVar32 = vfmadd231ps_avx512vl(auVar32,auVar30,auVar35);
              auVar33 = vfmadd213ps_avx512vl(ZEXT816(0),auVar29,auVar32);
              auVar33 = vaddps_avx512vl(auVar28,auVar33);
              auVar75._8_4_ = 0x40400000;
              auVar75._0_8_ = 0x4040000040400000;
              auVar75._12_4_ = 0x40400000;
              auVar32 = vfmadd231ps_avx512vl(auVar32,auVar29,auVar75);
              auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar28,auVar75);
              auVar34 = vmulps_avx512vl(auVar42,auVar35);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar31,auVar35);
              auVar35 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar39,auVar34);
              auVar70 = ZEXT816(0);
              auVar35 = vaddps_avx512vl(auVar40,auVar35);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar75);
              auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar40,auVar75);
              auVar36 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar30,auVar37);
              auVar36 = vfmadd231ps_avx512vl(auVar36,auVar29,auVar70);
              auVar36 = vfmadd231ps_avx512vl(auVar36,auVar28,auVar70);
              auVar37 = vmulps_avx512vl(auVar37,auVar75);
              auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar75,auVar30);
              auVar37 = vfmadd231ps_avx512vl(auVar37,auVar70,auVar29);
              auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar70,auVar28);
              auVar28 = vxorps_avx512vl(auVar28,auVar28);
              auVar28 = vfmadd213ps_avx512vl(auVar28,auVar31,auVar42);
              auVar28 = vfmadd231ps_avx512vl(auVar28,auVar39,auVar70);
              auVar37 = vfmadd231ps_avx512vl(auVar28,auVar40,auVar70);
              auVar95._0_4_ = auVar42._0_4_ * 3.0;
              auVar95._4_4_ = auVar42._4_4_ * 3.0;
              auVar95._8_4_ = auVar42._8_4_ * 3.0;
              auVar95._12_4_ = auVar42._12_4_ * 3.0;
              auVar28 = vfnmadd231ps_avx512vl(auVar95,auVar75,auVar31);
              auVar39 = vfmadd231ps_fma(auVar28,auVar70,auVar39);
              auVar29 = vfnmadd231ps_fma(auVar39,auVar70,auVar40);
              auVar39 = vshufps_avx(auVar32,auVar32,0xc9);
              auVar28 = vshufps_avx512vl(auVar35,auVar35,0xc9);
              auVar96._0_4_ = auVar32._0_4_ * auVar28._0_4_;
              auVar96._4_4_ = auVar32._4_4_ * auVar28._4_4_;
              auVar96._8_4_ = auVar32._8_4_ * auVar28._8_4_;
              auVar96._12_4_ = auVar32._12_4_ * auVar28._12_4_;
              auVar28 = vfmsub231ps_avx512vl(auVar96,auVar39,auVar35);
              auVar70 = ZEXT816(0);
              auVar28 = vshufps_avx(auVar28,auVar28,0xc9);
              auVar30 = vshufps_avx512vl(auVar34,auVar34,0xc9);
              auVar30 = vmulps_avx512vl(auVar32,auVar30);
              auVar39 = vfmsub231ps_avx512vl(auVar30,auVar39,auVar34);
              auVar30 = vshufps_avx512vl(auVar39,auVar39,0xc9);
              auVar39 = vshufps_avx512vl(auVar38,auVar38,0xc9);
              auVar40 = vshufps_avx512vl(auVar37,auVar37,0xc9);
              auVar42._0_4_ = auVar38._0_4_ * auVar40._0_4_;
              auVar42._4_4_ = auVar38._4_4_ * auVar40._4_4_;
              auVar42._8_4_ = auVar38._8_4_ * auVar40._8_4_;
              auVar42._12_4_ = auVar38._12_4_ * auVar40._12_4_;
              auVar37 = vfmsub231ps_avx512vl(auVar42,auVar39,auVar37);
              auVar37 = vshufps_avx(auVar37,auVar37,0xc9);
              auVar40 = vshufps_avx512vl(auVar29,auVar29,0xc9);
              auVar40 = vmulps_avx512vl(auVar38,auVar40);
              auVar39 = vfmsub231ps_avx512vl(auVar40,auVar39,auVar29);
              auVar29 = vshufps_avx512vl(auVar39,auVar39,0xc9);
              auVar39 = vdpps_avx(auVar28,auVar28,0x7f);
              auVar59._16_16_ = auVar41;
              auVar59._0_16_ = auVar70;
              auVar61._4_28_ = auVar59._4_28_;
              auVar61._0_4_ = auVar39._0_4_;
              auVar41 = vrsqrt14ss_avx512f(auVar70,auVar61._0_16_);
              auVar40 = vmulss_avx512f(auVar41,SUB6416(ZEXT464(0x3fc00000),0));
              auVar42 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
              auVar42 = vmulss_avx512f(auVar42,auVar41);
              auVar41 = vmulss_avx512f(auVar41,auVar41);
              auVar41 = vmulss_avx512f(auVar42,auVar41);
              auVar40 = vsubss_avx512f(auVar40,auVar41);
              auVar41 = vdpps_avx(auVar28,auVar30,0x7f);
              auVar40 = vbroadcastss_avx512vl(auVar40);
              auVar42 = vmulps_avx512vl(auVar40,auVar28);
              auVar31 = vbroadcastss_avx512vl(auVar39);
              auVar30 = vmulps_avx512vl(auVar31,auVar30);
              fVar69 = auVar41._0_4_;
              auVar31._0_4_ = auVar28._0_4_ * fVar69;
              auVar31._4_4_ = auVar28._4_4_ * fVar69;
              auVar31._8_4_ = auVar28._8_4_ * fVar69;
              auVar31._12_4_ = auVar28._12_4_ * fVar69;
              auVar41 = vsubps_avx(auVar30,auVar31);
              auVar28 = vrcp14ss_avx512f(auVar70,auVar61._0_16_);
              auVar39 = vfnmadd213ss_avx512f(auVar39,auVar28,ZEXT416(0x40000000));
              fVar69 = auVar28._0_4_ * auVar39._0_4_;
              auVar30._0_4_ = fVar69 * auVar41._0_4_;
              auVar30._4_4_ = fVar69 * auVar41._4_4_;
              auVar30._8_4_ = fVar69 * auVar41._8_4_;
              auVar30._12_4_ = fVar69 * auVar41._12_4_;
              auVar30 = vmulps_avx512vl(auVar40,auVar30);
              auVar41 = vdpps_avx(auVar37,auVar37,0x7f);
              auVar39 = vrsqrt14ss_avx512f(auVar70,ZEXT416(auVar41._0_4_));
              auVar28 = vmulss_avx512f(auVar39,SUB6416(ZEXT464(0x3fc00000),0));
              auVar40 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
              auVar40 = vmulss_avx512f(auVar40,auVar39);
              auVar39 = vmulss_avx512f(auVar40,ZEXT416((uint)(auVar39._0_4_ * auVar39._0_4_)));
              auVar39 = vsubss_avx512f(auVar28,auVar39);
              auVar97._0_4_ = auVar39._0_4_;
              auVar97._4_4_ = auVar97._0_4_;
              auVar97._8_4_ = auVar97._0_4_;
              auVar97._12_4_ = auVar97._0_4_;
              auVar39 = vdpps_avx(auVar37,auVar29,0x7f);
              auVar40 = vmulps_avx512vl(auVar37,auVar97);
              auVar28 = vbroadcastss_avx512vl(auVar41);
              auVar28 = vmulps_avx512vl(auVar28,auVar29);
              fVar69 = auVar39._0_4_;
              auVar35._0_4_ = auVar37._0_4_ * fVar69;
              auVar35._4_4_ = auVar37._4_4_ * fVar69;
              auVar35._8_4_ = auVar37._8_4_ * fVar69;
              auVar35._12_4_ = auVar37._12_4_ * fVar69;
              auVar28 = vsubps_avx(auVar28,auVar35);
              auVar39 = vrcp14ss_avx512f(auVar70,ZEXT416(auVar41._0_4_));
              auVar41 = vfnmadd213ss_avx512f(auVar41,auVar39,ZEXT416(0x40000000));
              fVar69 = auVar39._0_4_ * auVar41._0_4_;
              auVar41 = vshufps_avx(auVar33,auVar33,0xff);
              auVar31 = vmulps_avx512vl(auVar41,auVar42);
              auVar37 = vsubps_avx(auVar33,auVar31);
              auVar39 = vshufps_avx(auVar32,auVar32,0xff);
              auVar39 = vmulps_avx512vl(auVar39,auVar42);
              auVar34._0_4_ = auVar39._0_4_ + auVar41._0_4_ * auVar30._0_4_;
              auVar34._4_4_ = auVar39._4_4_ + auVar41._4_4_ * auVar30._4_4_;
              auVar34._8_4_ = auVar39._8_4_ + auVar41._8_4_ * auVar30._8_4_;
              auVar34._12_4_ = auVar39._12_4_ + auVar41._12_4_ * auVar30._12_4_;
              auVar29 = vsubps_avx(auVar32,auVar34);
              auVar42 = vaddps_avx512vl(auVar33,auVar31);
              auVar70._0_4_ = auVar32._0_4_ + auVar34._0_4_;
              auVar70._4_4_ = auVar32._4_4_ + auVar34._4_4_;
              auVar70._8_4_ = auVar32._8_4_ + auVar34._8_4_;
              auVar70._12_4_ = auVar32._12_4_ + auVar34._12_4_;
              auVar41 = vshufps_avx(auVar36,auVar36,0xff);
              auVar31 = vmulps_avx512vl(auVar41,auVar40);
              auVar30 = vsubps_avx(auVar36,auVar31);
              auVar39 = vshufps_avx(auVar38,auVar38,0xff);
              auVar39 = vmulps_avx512vl(auVar39,auVar40);
              auVar40._0_4_ = auVar39._0_4_ + auVar41._0_4_ * auVar97._0_4_ * auVar28._0_4_ * fVar69
              ;
              auVar40._4_4_ = auVar39._4_4_ + auVar41._4_4_ * auVar97._0_4_ * auVar28._4_4_ * fVar69
              ;
              auVar40._8_4_ = auVar39._8_4_ + auVar41._8_4_ * auVar97._0_4_ * auVar28._8_4_ * fVar69
              ;
              auVar40._12_4_ =
                   auVar39._12_4_ + auVar41._12_4_ * auVar97._0_4_ * auVar28._12_4_ * fVar69;
              auVar41 = vsubps_avx(auVar38,auVar40);
              auVar32._0_4_ = auVar36._0_4_ + auVar31._0_4_;
              auVar32._4_4_ = auVar36._4_4_ + auVar31._4_4_;
              auVar32._8_4_ = auVar36._8_4_ + auVar31._8_4_;
              auVar32._12_4_ = auVar36._12_4_ + auVar31._12_4_;
              auVar36._0_4_ = auVar38._0_4_ + auVar40._0_4_;
              auVar36._4_4_ = auVar38._4_4_ + auVar40._4_4_;
              auVar36._8_4_ = auVar38._8_4_ + auVar40._8_4_;
              auVar36._12_4_ = auVar38._12_4_ + auVar40._12_4_;
              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
              auVar28 = vmulps_avx512vl(auVar29,auVar39);
              fVar69 = auVar37._0_4_;
              auVar29._0_4_ = fVar69 + auVar28._0_4_;
              auVar29._4_4_ = auVar37._4_4_ + auVar28._4_4_;
              auVar29._8_4_ = auVar37._8_4_ + auVar28._8_4_;
              auVar29._12_4_ = auVar37._12_4_ + auVar28._12_4_;
              auVar41 = vmulps_avx512vl(auVar41,auVar39);
              auVar41 = vsubps_avx(auVar30,auVar41);
              auVar60._4_4_ = fVar69;
              auVar60._0_4_ = fVar69;
              auVar60._8_4_ = fVar69;
              auVar60._12_4_ = fVar69;
              auVar60._16_4_ = fVar69;
              auVar60._20_4_ = fVar69;
              auVar60._24_4_ = fVar69;
              auVar60._28_4_ = fVar69;
              auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
              auVar44 = vpermps_avx512vl(auVar43,ZEXT1632(auVar37));
              auVar88._8_4_ = 2;
              auVar88._0_8_ = 0x200000002;
              auVar88._12_4_ = 2;
              auVar88._16_4_ = 2;
              auVar88._20_4_ = 2;
              auVar88._24_4_ = 2;
              auVar88._28_4_ = 2;
              auVar61 = vpermps_avx2(auVar88,ZEXT1632(auVar37));
              auVar45 = vbroadcastss_avx512vl(auVar29);
              auVar46 = vpermps_avx512vl(auVar43,ZEXT1632(auVar29));
              auVar59 = vpermps_avx2(auVar88,ZEXT1632(auVar29));
              auVar47 = vbroadcastss_avx512vl(auVar41);
              auVar48 = vpermps_avx512vl(auVar43,ZEXT1632(auVar41));
              auVar57 = vpermps_avx2(auVar88,ZEXT1632(auVar41));
              auVar49 = vbroadcastss_avx512vl(auVar30);
              auVar50 = vpermps_avx512vl(auVar43,ZEXT1632(auVar30));
              auVar58 = vpermps_avx2(auVar88,ZEXT1632(auVar30));
              auVar65._8_8_ = bezier_basis0._3952_8_;
              auVar65._0_8_ = bezier_basis0._3944_8_;
              auVar65._16_8_ = bezier_basis0._3960_8_;
              auVar65._24_8_ = bezier_basis0._3968_8_;
              auVar51 = vmulps_avx512vl(auVar49,auVar65);
              auVar66._8_4_ = fStack_180;
              auVar66._0_8_ = bezier_basis0._2788_8_;
              auVar66._12_4_ = fStack_17c;
              auVar66._16_8_ = bezier_basis0._2804_8_;
              auVar66._24_8_ = bezier_basis0._2812_8_;
              auVar52 = vfmadd231ps_avx512vl(auVar51,auVar66,auVar47);
              auVar64._8_8_ = bezier_basis0._8576_8_;
              auVar64._0_8_ = bezier_basis0._8568_8_;
              auVar64._16_8_ = bezier_basis0._8584_8_;
              auVar64._24_8_ = bezier_basis0._8592_8_;
              auVar49 = vmulps_avx512vl(auVar49,auVar64);
              auVar51._8_8_ = bezier_basis0._7420_8_;
              auVar51._0_8_ = bezier_basis0._7412_8_;
              auVar51._16_8_ = bezier_basis0._7428_8_;
              auVar51._24_8_ = bezier_basis0._7436_8_;
              auVar53 = vfmadd231ps_avx512vl(auVar49,auVar51,auVar47);
              auVar47 = vmulps_avx512vl(auVar50,auVar65);
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar66,auVar48);
              auVar49 = vmulps_avx512vl(auVar50,auVar64);
              auVar54 = vfmadd231ps_avx512vl(auVar49,auVar51,auVar48);
              auVar48 = vmulps_avx512vl(auVar58,auVar65);
              auVar49 = vfmadd231ps_avx512vl(auVar48,auVar66,auVar57);
              auVar48._8_4_ = fStack_200;
              auVar48._0_8_ = bezier_basis0._1632_8_;
              auVar48._12_4_ = fStack_1fc;
              auVar48._16_8_ = bezier_basis0._1648_8_;
              auVar48._24_8_ = bezier_basis0._1656_8_;
              auVar50 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar45);
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar48,auVar46);
              auVar52 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar59);
              auVar49._8_4_ = fStack_1c0;
              auVar49._0_8_ = bezier_basis0._476_8_;
              auVar49._12_4_ = fStack_1bc;
              auVar49._16_8_ = bezier_basis0._492_8_;
              auVar49._24_8_ = bezier_basis0._500_8_;
              auVar55 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar60);
              auVar56 = vfmadd231ps_avx512vl(auVar47,auVar49,auVar44);
              auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar61);
              auVar47._4_4_ = auVar58._4_4_ * SUB84(bezier_basis0._8568_8_,4);
              auVar47._0_4_ = auVar58._0_4_ * (float)bezier_basis0._8568_8_;
              auVar47._8_4_ = auVar58._8_4_ * (float)bezier_basis0._8576_8_;
              auVar47._12_4_ = auVar58._12_4_ * SUB84(bezier_basis0._8576_8_,4);
              auVar47._16_4_ = auVar58._16_4_ * (float)bezier_basis0._8584_8_;
              auVar47._20_4_ = auVar58._20_4_ * SUB84(bezier_basis0._8584_8_,4);
              auVar47._24_4_ = auVar58._24_4_ * (float)bezier_basis0._8592_8_;
              auVar47._28_4_ = auVar58._28_4_;
              auVar57 = vfmadd231ps_avx512vl(auVar47,auVar51,auVar57);
              auVar50._8_8_ = bezier_basis0._6264_8_;
              auVar50._0_8_ = bezier_basis0._6256_8_;
              auVar50._16_8_ = bezier_basis0._6272_8_;
              auVar50._24_8_ = bezier_basis0._6280_8_;
              auVar58 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar45);
              auVar47 = vfmadd231ps_avx512vl(auVar54,auVar50,auVar46);
              auVar41 = vfmadd231ps_fma(auVar57,auVar50,auVar59);
              auVar45._8_8_ = bezier_basis0._5108_8_;
              auVar45._0_8_ = bezier_basis0._5100_8_;
              auVar45._16_8_ = bezier_basis0._5116_8_;
              auVar45._24_8_ = bezier_basis0._5124_8_;
              auVar59 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar60);
              auVar57 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar44);
              auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar45,auVar61);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
              auVar44 = vmulps_avx512vl(auVar59,auVar47);
              auVar46 = vmulps_avx512vl(auVar57,auVar47);
              auVar53 = vmulps_avx512vl(ZEXT1632(auVar41),auVar47);
              auVar30 = ZEXT816(0) << 0x40;
              auVar61 = vblendps_avx(auVar44,ZEXT1632(auVar30),1);
              auVar59 = vblendps_avx(auVar46,ZEXT1632(auVar30),1);
              auVar62 = ZEXT1632(auVar30);
              auVar57 = vblendps_avx(auVar53,auVar62,1);
              auVar58 = vsubps_avx(auVar55,auVar61);
              auVar54 = vsubps_avx512vl(auVar56,auVar59);
              auVar60 = vsubps_avx512vl(auVar52,auVar57);
              auVar61 = vblendps_avx(auVar44,auVar62,0x80);
              auVar59 = vblendps_avx(auVar46,auVar62,0x80);
              auVar57 = vblendps_avx(auVar53,auVar62,0x80);
              auVar63._0_4_ = auVar55._0_4_ + auVar61._0_4_;
              auVar63._4_4_ = auVar55._4_4_ + auVar61._4_4_;
              auVar63._8_4_ = auVar55._8_4_ + auVar61._8_4_;
              auVar63._12_4_ = auVar55._12_4_ + auVar61._12_4_;
              auVar63._16_4_ = auVar55._16_4_ + auVar61._16_4_;
              auVar63._20_4_ = auVar55._20_4_ + auVar61._20_4_;
              auVar63._24_4_ = auVar55._24_4_ + auVar61._24_4_;
              auVar63._28_4_ = auVar55._28_4_ + auVar61._28_4_;
              auVar59 = vaddps_avx512vl(auVar56,auVar59);
              auVar57 = vaddps_avx512vl(auVar52,auVar57);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar61 = vminps_avx512vl(auVar44,auVar55);
              auVar46 = vminps_avx512vl(auVar44,auVar56);
              auVar53 = vminps_avx512vl(auVar44,auVar52);
              auVar62 = vminps_avx512vl(auVar58,auVar63);
              auVar62 = vminps_avx512vl(auVar61,auVar62);
              auVar61 = vminps_avx512vl(auVar54,auVar59);
              auVar46 = vminps_avx512vl(auVar46,auVar61);
              auVar61 = vminps_avx512vl(auVar60,auVar57);
              auVar53 = vminps_avx512vl(auVar53,auVar61);
              auVar61 = vmaxps_avx(auVar58,auVar63);
              auVar41 = vmulps_avx512vl(auVar70,auVar39);
              auVar37 = vaddps_avx512vl(auVar42,auVar41);
              auVar41 = vmulps_avx512vl(auVar36,auVar39);
              auVar29 = vsubps_avx512vl(auVar32,auVar41);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar58 = vmaxps_avx512vl(auVar63,auVar55);
              auVar55 = vmaxps_avx512vl(auVar63,auVar56);
              auVar52 = vmaxps_avx512vl(auVar63,auVar52);
              auVar61 = vmaxps_avx(auVar58,auVar61);
              auVar59 = vmaxps_avx(auVar54,auVar59);
              auVar59 = vmaxps_avx(auVar55,auVar59);
              auVar57 = vmaxps_avx(auVar60,auVar57);
              auVar57 = vmaxps_avx(auVar52,auVar57);
              auVar58 = vshufps_avx512vl(auVar62,auVar62,0xb1);
              auVar52 = vminps_avx512vl(auVar62,auVar58);
              auVar58 = vshufpd_avx(auVar52,auVar52,5);
              auVar58 = vminps_avx(auVar52,auVar58);
              auVar41 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar58 = vshufps_avx512vl(auVar46,auVar46,0xb1);
              auVar46 = vminps_avx512vl(auVar46,auVar58);
              auVar58 = vshufpd_avx(auVar46,auVar46,5);
              auVar58 = vminps_avx(auVar46,auVar58);
              auVar39 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar39 = vunpcklps_avx(auVar41,auVar39);
              auVar58 = vshufps_avx512vl(auVar53,auVar53,0xb1);
              auVar46 = vminps_avx512vl(auVar53,auVar58);
              auVar58 = vshufpd_avx(auVar46,auVar46,5);
              auVar58 = vminps_avx(auVar46,auVar58);
              auVar41 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar41 = vinsertps_avx(auVar39,auVar41,0x28);
              auVar58 = vshufps_avx(auVar61,auVar61,0xb1);
              auVar61 = vmaxps_avx(auVar61,auVar58);
              auVar58 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar58);
              auVar39 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar61 = vshufps_avx(auVar59,auVar59,0xb1);
              auVar61 = vmaxps_avx(auVar59,auVar61);
              auVar59 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar59);
              auVar28 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar28 = vunpcklps_avx(auVar39,auVar28);
              auVar61 = vshufps_avx(auVar57,auVar57,0xb1);
              auVar61 = vmaxps_avx(auVar57,auVar61);
              auVar59 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar59);
              auVar39 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar39 = vinsertps_avx(auVar28,auVar39,0x28);
              auVar58 = vbroadcastss_avx512vl(auVar42);
              auVar46 = vpermps_avx512vl(auVar43,ZEXT1632(auVar42));
              auVar52 = vpermps_avx512vl(auVar88,ZEXT1632(auVar42));
              uVar80 = auVar37._0_4_;
              auVar62._4_4_ = uVar80;
              auVar62._0_4_ = uVar80;
              auVar62._8_4_ = uVar80;
              auVar62._12_4_ = uVar80;
              auVar62._16_4_ = uVar80;
              auVar62._20_4_ = uVar80;
              auVar62._24_4_ = uVar80;
              auVar62._28_4_ = uVar80;
              auVar53 = vpermps_avx512vl(auVar43,ZEXT1632(auVar37));
              auVar61 = vpermps_avx2(auVar88,ZEXT1632(auVar37));
              auVar57 = vbroadcastss_avx512vl(auVar29);
              auVar54 = vpermps_avx512vl(auVar43,ZEXT1632(auVar29));
              auVar55 = vpermps_avx512vl(auVar88,ZEXT1632(auVar29));
              auVar56 = vbroadcastss_avx512vl(auVar32);
              auVar43 = vpermps_avx512vl(auVar43,ZEXT1632(auVar32));
              auVar59 = vpermps_avx2(auVar88,ZEXT1632(auVar32));
              auVar60 = vmulps_avx512vl(auVar56,auVar65);
              auVar28 = vfmadd231ps_fma(auVar60,auVar66,auVar57);
              auVar56 = vmulps_avx512vl(auVar56,auVar64);
              auVar56 = vfmadd231ps_avx512vl(auVar56,auVar51,auVar57);
              auVar57 = vmulps_avx512vl(auVar43,auVar65);
              auVar57 = vfmadd231ps_avx512vl(auVar57,auVar66,auVar54);
              auVar64 = vmulps_avx512vl(auVar43,auVar64);
              auVar64 = vfmadd231ps_avx512vl(auVar64,auVar51,auVar54);
              auVar65 = vmulps_avx512vl(auVar59,auVar65);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar55);
              auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar48,auVar62);
              auVar57 = vfmadd231ps_avx512vl(auVar57,auVar48,auVar53);
              auVar48 = vfmadd231ps_avx512vl(auVar65,auVar48,auVar61);
              auVar65 = vfmadd231ps_avx512vl(auVar66,auVar49,auVar58);
              auVar66 = vfmadd231ps_avx512vl(auVar57,auVar49,auVar46);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar49,auVar52);
              auVar57._4_4_ = auVar59._4_4_ * SUB84(bezier_basis0._8568_8_,4);
              auVar57._0_4_ = auVar59._0_4_ * (float)bezier_basis0._8568_8_;
              auVar57._8_4_ = auVar59._8_4_ * (float)bezier_basis0._8576_8_;
              auVar57._12_4_ = auVar59._12_4_ * SUB84(bezier_basis0._8576_8_,4);
              auVar57._16_4_ = auVar59._16_4_ * (float)bezier_basis0._8584_8_;
              auVar57._20_4_ = auVar59._20_4_ * SUB84(bezier_basis0._8584_8_,4);
              auVar57._24_4_ = auVar59._24_4_ * (float)bezier_basis0._8592_8_;
              auVar57._28_4_ = auVar59._28_4_;
              auVar59 = vfmadd231ps_avx512vl(auVar57,auVar51,auVar55);
              auVar57 = vfmadd231ps_avx512vl(auVar56,auVar50,auVar62);
              auVar49 = vfmadd231ps_avx512vl(auVar64,auVar50,auVar53);
              auVar28 = vfmadd231ps_fma(auVar59,auVar50,auVar61);
              auVar61 = vfmadd231ps_avx512vl(auVar57,auVar45,auVar58);
              auVar59 = vfmadd231ps_avx512vl(auVar49,auVar45,auVar46);
              auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar45,auVar52);
              auVar49 = vmulps_avx512vl(auVar61,auVar47);
              auVar50 = vmulps_avx512vl(auVar59,auVar47);
              auVar51 = vmulps_avx512vl(ZEXT1632(auVar28),auVar47);
              auVar64 = ZEXT1632(auVar30);
              auVar61 = vblendps_avx(auVar49,auVar64,1);
              auVar59 = vblendps_avx(auVar50,auVar64,1);
              auVar57 = vblendps_avx(auVar51,auVar64,1);
              auVar58 = vsubps_avx(auVar65,auVar61);
              auVar47 = vsubps_avx(auVar66,auVar59);
              auVar45 = vsubps_avx512vl(auVar48,auVar57);
              auVar61 = vblendps_avx(auVar49,auVar64,0x80);
              auVar59 = vblendps_avx(auVar50,auVar64,0x80);
              auVar57 = vblendps_avx(auVar51,auVar64,0x80);
              auVar43._0_4_ = auVar65._0_4_ + auVar61._0_4_;
              auVar43._4_4_ = auVar65._4_4_ + auVar61._4_4_;
              auVar43._8_4_ = auVar65._8_4_ + auVar61._8_4_;
              auVar43._12_4_ = auVar65._12_4_ + auVar61._12_4_;
              auVar43._16_4_ = auVar65._16_4_ + auVar61._16_4_;
              auVar43._20_4_ = auVar65._20_4_ + auVar61._20_4_;
              auVar43._24_4_ = auVar65._24_4_ + auVar61._24_4_;
              auVar43._28_4_ = auVar65._28_4_ + auVar61._28_4_;
              auVar46._0_4_ = auVar66._0_4_ + auVar59._0_4_;
              auVar46._4_4_ = auVar66._4_4_ + auVar59._4_4_;
              auVar46._8_4_ = auVar66._8_4_ + auVar59._8_4_;
              auVar46._12_4_ = auVar66._12_4_ + auVar59._12_4_;
              auVar46._16_4_ = auVar66._16_4_ + auVar59._16_4_;
              auVar46._20_4_ = auVar66._20_4_ + auVar59._20_4_;
              auVar46._24_4_ = auVar66._24_4_ + auVar59._24_4_;
              auVar46._28_4_ = auVar66._28_4_ + auVar59._28_4_;
              auVar57 = vaddps_avx512vl(auVar48,auVar57);
              auVar61 = vminps_avx512vl(auVar44,auVar65);
              auVar59 = vminps_avx512vl(auVar44,auVar66);
              auVar49 = vminps_avx512vl(auVar44,auVar48);
              auVar50 = vminps_avx512vl(auVar58,auVar43);
              auVar50 = vminps_avx512vl(auVar61,auVar50);
              auVar61 = vminps_avx512vl(auVar47,auVar46);
              auVar51 = vminps_avx512vl(auVar59,auVar61);
              auVar61 = vminps_avx512vl(auVar45,auVar57);
              auVar49 = vminps_avx512vl(auVar49,auVar61);
              auVar61 = vmaxps_avx(auVar58,auVar43);
              auVar59 = vmaxps_avx512vl(auVar63,auVar65);
              auVar61 = vmaxps_avx(auVar59,auVar61);
              auVar59 = vmaxps_avx(auVar47,auVar46);
              auVar58 = vmaxps_avx512vl(auVar63,auVar66);
              auVar59 = vmaxps_avx(auVar58,auVar59);
              auVar57 = vmaxps_avx(auVar45,auVar57);
              auVar58 = vmaxps_avx512vl(auVar63,auVar48);
              auVar57 = vmaxps_avx(auVar58,auVar57);
              auVar58 = vshufps_avx(auVar50,auVar50,0xb1);
              auVar58 = vminps_avx(auVar50,auVar58);
              auVar47 = vshufpd_avx(auVar58,auVar58,5);
              auVar58 = vminps_avx(auVar58,auVar47);
              auVar28 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar58 = vshufps_avx512vl(auVar51,auVar51,0xb1);
              auVar47 = vminps_avx512vl(auVar51,auVar58);
              auVar58 = vshufpd_avx(auVar47,auVar47,5);
              auVar58 = vminps_avx(auVar47,auVar58);
              auVar37 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar37 = vunpcklps_avx(auVar28,auVar37);
              auVar58 = vshufps_avx512vl(auVar49,auVar49,0xb1);
              auVar47 = vminps_avx512vl(auVar49,auVar58);
              auVar58 = vshufpd_avx(auVar47,auVar47,5);
              auVar58 = vminps_avx(auVar47,auVar58);
              auVar28 = vminps_avx(auVar58._0_16_,auVar58._16_16_);
              auVar28 = vinsertps_avx(auVar37,auVar28,0x28);
              auVar37 = vminps_avx(auVar41,auVar28);
              auVar58 = vshufps_avx(auVar61,auVar61,0xb1);
              auVar61 = vmaxps_avx(auVar61,auVar58);
              auVar58 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar58);
              auVar41 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar61 = vshufps_avx(auVar59,auVar59,0xb1);
              auVar61 = vmaxps_avx(auVar59,auVar61);
              auVar59 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar59);
              auVar28 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar28 = vunpcklps_avx(auVar41,auVar28);
              auVar61 = vshufps_avx(auVar57,auVar57,0xb1);
              auVar61 = vmaxps_avx(auVar57,auVar61);
              auVar59 = vshufpd_avx(auVar61,auVar61,5);
              auVar61 = vmaxps_avx(auVar61,auVar59);
              auVar41 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
              auVar41 = vinsertps_avx(auVar28,auVar41,0x28);
              auVar39 = vmaxps_avx(auVar39,auVar41);
              auVar41 = auVar47._16_16_;
              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
              uVar14 = vcmpps_avx512vl(auVar39,auVar28,1);
              uVar13 = vcmpps_avx512vl(auVar37,auVar26,6);
              if ((~((ushort)uVar14 & (ushort)uVar13) & 7) != 0) {
                auVar81 = ZEXT864(0) << 0x20;
                auVar83 = ZEXT864(0) << 0x20;
                goto LAB_01ef6469;
              }
              uVar21 = uVar21 + 1;
              lVar22 = lVar22 + 0x38;
              auVar83 = ZEXT864(0) << 0x20;
            } while (uVar21 <= (ulong)(long)(int)auVar27._0_4_);
            auVar39._8_8_ = 0;
            auVar39._0_4_ =
                 (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.lower;
            auVar39._4_4_ =
                 (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.upper;
            auVar28 = ZEXT816(0) << 0x20;
          }
          local_168.primID = &local_1d0;
          auVar26 = vmovshdup_avx(auVar39);
          fVar67 = auVar39._0_4_;
          local_1a8 = auVar26._0_4_ - fVar67;
          local_158 = (auVar25._0_4_ - fVar67) / local_1a8;
          local_1a8 = (fVar82 - fVar67) / local_1a8;
          fVar67 = fVar12 * local_158;
          fVar69 = fVar12 * local_1a8;
          auVar27 = vroundss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),9);
          auVar39 = vroundss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),10);
          auVar26 = vmaxss_avx(auVar27,auVar28);
          local_188 = auVar26._0_4_;
          auVar26 = vminss_avx(auVar39,ZEXT416((uint)fVar12));
          iVar20 = (int)local_188;
          local_1c8 = auVar26._0_4_;
          iVar23 = (int)local_1c8;
          uVar2 = (int)auVar27._0_4_;
          if ((int)auVar27._0_4_ < 0) {
            uVar2 = 0xffffffff;
          }
          iVar19 = (int)fVar12 + 1;
          if ((int)auVar39._0_4_ < (int)fVar12 + 1) {
            iVar19 = (int)auVar39._0_4_;
          }
          local_1d0 = uVar24;
          local_168.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_118.field_1,&local_168,(long)iVar20);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_138.field_1,&local_168,(long)iVar23);
          fVar67 = fVar67 - local_188;
          if (iVar19 - uVar2 == 1) {
            auVar26 = vmaxss_avx(ZEXT416((uint)fVar67),ZEXT816(0) << 0x40);
            fVar67 = auVar26._0_4_;
            fVar12 = 1.0 - fVar67;
            auVar84._0_4_ = fVar67 * local_138.m128[0];
            auVar84._4_4_ = fVar67 * local_138.m128[1];
            auVar84._8_4_ = fVar67 * local_138.m128[2];
            auVar84._12_4_ = fVar67 * local_138.m128[3];
            auVar73._4_4_ = fVar12;
            auVar73._0_4_ = fVar12;
            auVar73._8_4_ = fVar12;
            auVar73._12_4_ = fVar12;
            auVar37 = vfmadd231ps_fma(auVar84,auVar73,(undefined1  [16])local_118);
            auVar86._0_4_ = fVar67 * local_128._0_4_;
            auVar86._4_4_ = fVar67 * local_128._4_4_;
            auVar86._8_4_ = fVar67 * local_128._8_4_;
            auVar86._12_4_ = fVar67 * local_128._12_4_;
            auVar38 = vfmadd231ps_fma(auVar86,local_108,auVar73);
            auVar26 = vmaxss_avx(ZEXT416((uint)(local_1c8 - fVar69)),ZEXT816(0) << 0x40);
            fVar67 = auVar26._0_4_;
            fVar12 = 1.0 - fVar67;
            auVar89._0_4_ = fVar67 * local_118.m128[0];
            auVar89._4_4_ = fVar67 * local_118.m128[1];
            auVar89._8_4_ = fVar67 * local_118.m128[2];
            auVar89._12_4_ = fVar67 * local_118.m128[3];
            auVar74._4_4_ = fVar12;
            auVar74._0_4_ = fVar12;
            auVar74._8_4_ = fVar12;
            auVar74._12_4_ = fVar12;
            auVar91 = vfmadd231ps_fma(auVar89,auVar74,(undefined1  [16])local_138);
            auVar92._0_4_ = fVar67 * local_108._0_4_;
            auVar92._4_4_ = fVar67 * local_108._4_4_;
            auVar92._8_4_ = fVar67 * local_108._8_4_;
            auVar92._12_4_ = fVar67 * local_108._12_4_;
            auVar94 = vfmadd231ps_fma(auVar92,auVar74,local_128);
            auVar26 = ZEXT816(0);
            auVar83 = ZEXT464(0) << 0x40;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_168,(long)(iVar20 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_98.field_1,&local_168,(long)(iVar23 + -1));
            auVar26 = vmaxss_avx(ZEXT416((uint)fVar67),ZEXT816(0) << 0x40);
            fVar68 = auVar26._0_4_;
            auVar85._0_4_ = fVar68 * local_78.m128[0];
            auVar85._4_4_ = fVar68 * local_78.m128[1];
            auVar85._8_4_ = fVar68 * local_78.m128[2];
            auVar85._12_4_ = fVar68 * local_78.m128[3];
            fVar67 = 1.0 - fVar68;
            auVar71._4_4_ = fVar67;
            auVar71._0_4_ = fVar67;
            auVar71._8_4_ = fVar67;
            auVar71._12_4_ = fVar67;
            auVar37 = vfmadd231ps_fma(auVar85,auVar71,(undefined1  [16])local_118);
            auVar87._0_4_ = fVar68 * local_68;
            auVar87._4_4_ = fVar68 * fStack_64;
            auVar87._8_4_ = fVar68 * fStack_60;
            auVar87._12_4_ = fVar68 * fStack_5c;
            auVar38 = vfmadd231ps_fma(auVar87,auVar71,local_108);
            auVar26 = vmaxss_avx(ZEXT416((uint)(local_1c8 - fVar69)),ZEXT816(0) << 0x40);
            fVar69 = auVar26._0_4_;
            fVar67 = 1.0 - fVar69;
            auVar90._0_4_ = fVar69 * local_98.m128[0];
            auVar90._4_4_ = fVar69 * local_98.m128[1];
            auVar90._8_4_ = fVar69 * local_98.m128[2];
            auVar90._12_4_ = fVar69 * local_98.m128[3];
            auVar76._4_4_ = fVar67;
            auVar76._0_4_ = fVar67;
            auVar76._8_4_ = fVar67;
            auVar76._12_4_ = fVar67;
            auVar91 = vfmadd231ps_fma(auVar90,auVar76,(undefined1  [16])local_138);
            auVar93._0_4_ = fVar69 * local_88;
            auVar93._4_4_ = fVar69 * fStack_84;
            auVar93._8_4_ = fVar69 * fStack_80;
            auVar93._12_4_ = fVar69 * fStack_7c;
            auVar94 = vfmadd231ps_fma(auVar93,auVar76,local_128);
            if ((int)(uVar2 + 1) < iVar19) {
              local_f8 = local_1a8 - local_158;
              itime = (size_t)(uVar2 + 1);
              iVar19 = ~uVar2 + iVar19;
              do {
                local_188 = auVar94._0_4_;
                fStack_184 = auVar94._4_4_;
                fStack_180 = auVar94._8_4_;
                fStack_17c = auVar94._12_4_;
                local_208 = auVar91._0_4_;
                fStack_204 = auVar91._4_4_;
                fStack_200 = auVar91._8_4_;
                fStack_1fc = auVar91._12_4_;
                local_1c8 = auVar38._0_4_;
                fStack_1c4 = auVar38._4_4_;
                fStack_1c0 = auVar38._8_4_;
                fStack_1bc = auVar38._12_4_;
                fVar69 = ((float)(int)itime / fVar12 - local_158) / local_f8;
                fVar67 = 1.0 - fVar69;
                auVar78._0_4_ = local_208 * fVar69;
                auVar78._4_4_ = fStack_204 * fVar69;
                auVar78._8_4_ = fStack_200 * fVar69;
                auVar78._12_4_ = fStack_1fc * fVar69;
                auVar77._4_4_ = fVar67;
                auVar77._0_4_ = fVar67;
                auVar77._8_4_ = fVar67;
                auVar77._12_4_ = fVar67;
                auVar26 = vfmadd231ps_fma(auVar78,auVar77,auVar37);
                local_1a8 = auVar26._0_4_;
                uStack_1a4 = auVar26._4_4_;
                uStack_1a0 = auVar26._8_8_;
                auVar72._0_4_ = local_188 * fVar69;
                auVar72._4_4_ = fStack_184 * fVar69;
                auVar72._8_4_ = fStack_180 * fVar69;
                auVar72._12_4_ = fStack_17c * fVar69;
                auVar26 = vfmadd231ps_fma(auVar72,auVar38,auVar77);
                local_d8 = auVar26._0_8_;
                uStack_d0 = auVar26._8_8_;
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_b8.field_1,&local_168,itime);
                local_268 = auVar37._0_4_;
                fStack_264 = auVar37._4_4_;
                fStack_260 = auVar37._8_4_;
                fStack_25c = auVar37._12_4_;
                auVar26 = ZEXT816(0) << 0x40;
                auVar15._4_4_ = uStack_1a4;
                auVar15._0_4_ = local_1a8;
                auVar15._8_8_ = uStack_1a0;
                auVar27 = vsubps_avx((undefined1  [16])local_b8,auVar15);
                auVar16._8_8_ = uStack_d0;
                auVar16._0_8_ = local_d8;
                auVar28 = vsubps_avx(local_a8,auVar16);
                auVar39 = vminps_avx(auVar27,auVar26);
                auVar27 = vmaxps_avx(auVar28,auVar26);
                auVar37._0_4_ = local_268 + auVar39._0_4_;
                auVar37._4_4_ = fStack_264 + auVar39._4_4_;
                auVar37._8_4_ = fStack_260 + auVar39._8_4_;
                auVar37._12_4_ = fStack_25c + auVar39._12_4_;
                auVar91._0_4_ = local_208 + auVar39._0_4_;
                auVar91._4_4_ = fStack_204 + auVar39._4_4_;
                auVar91._8_4_ = fStack_200 + auVar39._8_4_;
                auVar91._12_4_ = fStack_1fc + auVar39._12_4_;
                auVar38._0_4_ = local_1c8 + auVar27._0_4_;
                auVar38._4_4_ = fStack_1c4 + auVar27._4_4_;
                auVar38._8_4_ = fStack_1c0 + auVar27._8_4_;
                auVar38._12_4_ = fStack_1bc + auVar27._12_4_;
                auVar94._0_4_ = local_188 + auVar27._0_4_;
                auVar94._4_4_ = fStack_184 + auVar27._4_4_;
                auVar94._8_4_ = fStack_180 + auVar27._8_4_;
                auVar94._12_4_ = fStack_17c + auVar27._12_4_;
                itime = itime + 1;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            else {
              auVar26 = ZEXT816(0) << 0x40;
            }
            auVar83 = ZEXT1664(auVar26);
            auVar26 = ZEXT816(0) << 0x20;
          }
          auVar81 = ZEXT1664(auVar26 << 0x20);
          uVar14 = vcmpps_avx512vl(auVar37,auVar38,2);
          if (((~(ushort)uVar14 & 7) == 0) &&
             (uVar14 = vcmpps_avx512vl(auVar91,auVar94,2), (~(ushort)uVar14 & 7) == 0)) {
            auVar26 = vminps_avx(auVar37,auVar91);
            aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar26,ZEXT416(geomID),0x30);
            auVar26 = vmaxps_avx(auVar38,auVar94);
            aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar26,ZEXT416((uint)uVar24),0x30);
            auVar79._0_4_ = aVar10.x + aVar11.x;
            auVar79._4_4_ = aVar10.y + aVar11.y;
            auVar79._8_4_ = aVar10.z + aVar11.z;
            auVar79._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
            local_248 = vminps_avx(local_248,(undefined1  [16])aVar10);
            local_238 = vmaxps_avx(local_238,(undefined1  [16])aVar11);
            local_218 = vminps_avx(local_218,auVar79);
            local_228 = vmaxps_avx(local_228,auVar79);
            local_270 = local_270 + 1;
            prims[local_250].lower.field_0.field_1 = aVar10;
            prims[local_250].upper.field_0.field_1 = aVar11;
            local_250 = local_250 + 1;
          }
        }
LAB_01ef6469:
        uVar24 = uVar24 + 1;
      } while (uVar24 < r->_end);
    }
    else {
      local_270 = 0;
      local_238._8_4_ = 0xff800000;
      local_238._0_8_ = 0xff800000ff800000;
      local_238._12_4_ = 0xff800000;
      local_248._8_4_ = 0x7f800000;
      local_248._0_8_ = 0x7f8000007f800000;
      local_248._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_248._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_248._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_238._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_238._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_218._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_218._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_228._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_228._8_8_;
    __return_storage_ptr__->end = local_270;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }